

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::PackageImportDeclarationSyntax::PackageImportDeclarationSyntax
          (PackageImportDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,
          SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *items,Token semi)

{
  bool bVar1;
  PackageImportItemSyntax *pPVar2;
  size_t in_RCX;
  SyntaxNode *in_RDX;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *in_RDI;
  PackageImportItemSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *rhs;
  undefined1 in_stack_ffffffffffffffc0 [16];
  MemberSyntax *in_stack_ffffffffffffffd0;
  
  rhs = (SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *)&stack0x00000008;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0._12_4_,
             in_stack_ffffffffffffffc0._0_8_);
  in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode = in_RDX;
  in_RDI[1].super_SyntaxListBase.childCount = in_RCX;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::SeparatedSyntaxList(in_RDI,rhs);
  in_RDI[2].elements._M_ptr = (pointer)(rhs->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[2].elements._M_extent._M_extent_value =
       *(size_t *)&(rhs->super_SyntaxListBase).super_SyntaxNode;
  in_RDI[2].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)in_RDI;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *)0xa39829);
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::end(in_RDI);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>_>
                      ((self_type *)in_RDI,
                       (iterator_base<slang::syntax::PackageImportItemSyntax_*> *)rhs);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pPVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>,_false>
                          *)0xa39868);
    (pPVar2->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>,_false>
                *)in_RDI);
  }
  return;
}

Assistant:

PackageImportDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, const SeparatedSyntaxList<PackageImportItemSyntax>& items, Token semi) :
        MemberSyntax(SyntaxKind::PackageImportDeclaration, attributes), keyword(keyword), items(items), semi(semi) {
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }